

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O2

void Abc_NtkUpdateLevel(Abc_Obj_t *pObjNew,Vec_Vec_t *vLevels)

{
  void *Entry;
  uint uVar1;
  uint uVar2;
  Vec_Ptr_t *pVVar3;
  Abc_Obj_t *pObj;
  uint Level;
  long lVar4;
  int i;
  
  Level = *(uint *)&pObjNew->field_0x14 >> 0xc;
  uVar1 = Abc_ObjLevelNew(pObjNew);
  if (Level != uVar1) {
    Vec_VecClear(vLevels);
    Vec_VecPush(vLevels,Level,pObjNew);
    pObjNew->field_0x14 = pObjNew->field_0x14 | 0x10;
    for (; (int)Level < vLevels->nSize; Level = Level + 1) {
      i = 0;
      while( true ) {
        pVVar3 = Vec_VecEntry(vLevels,Level);
        if (pVVar3->nSize <= i) break;
        pVVar3 = Vec_VecEntry(vLevels,Level);
        pObj = (Abc_Obj_t *)Vec_PtrEntry(pVVar3,i);
        uVar1 = *(uint *)&pObj->field_0x14;
        *(uint *)&pObj->field_0x14 = uVar1 & 0xffffffef;
        if (uVar1 >> 0xc != Level) {
          __assert_fail("Abc_ObjLevel(pTemp) == Lev",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcTiming.c"
                        ,0x514,"void Abc_NtkUpdateLevel(Abc_Obj_t *, Vec_Vec_t *)");
        }
        uVar2 = Abc_ObjLevelNew(pObj);
        *(uint *)&pObj->field_0x14 = uVar1 & 0xfef | uVar2 << 0xc;
        if ((uVar2 & 0xfffff) != Level) {
          for (lVar4 = 0; lVar4 < (pObj->vFanouts).nSize; lVar4 = lVar4 + 1) {
            Entry = pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar4]];
            uVar1 = *(uint *)((long)Entry + 0x14);
            if (((uVar1 & 0x10) == 0) && ((uVar1 & 0xf) - 5 < 0xfffffffe)) {
              if (uVar1 >> 0xc < Level) {
                __assert_fail("Abc_ObjLevel(pFanout) >= Lev",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcTiming.c"
                              ,0x51e,"void Abc_NtkUpdateLevel(Abc_Obj_t *, Vec_Vec_t *)");
              }
              Vec_VecPush(vLevels,uVar1 >> 0xc,Entry);
              *(byte *)((long)Entry + 0x14) = *(byte *)((long)Entry + 0x14) | 0x10;
            }
          }
        }
        i = i + 1;
      }
    }
  }
  return;
}

Assistant:

void Abc_NtkUpdateLevel( Abc_Obj_t * pObjNew, Vec_Vec_t * vLevels )
{
    Abc_Obj_t * pFanout, * pTemp;
    int LevelOld, Lev, k, m;
//    int Counter = 0, CounterMax = 0;
    // check if level has changed
    LevelOld = Abc_ObjLevel(pObjNew);
    if ( LevelOld == Abc_ObjLevelNew(pObjNew) )
        return;
    // start the data structure for level update
    // we cannot fail to visit a node when using this structure because the 
    // nodes are stored by their _old_ levels, which are assumed to be correct
    Vec_VecClear( vLevels );
    Vec_VecPush( vLevels, LevelOld, pObjNew );
    pObjNew->fMarkA = 1;
    // recursively update level
    Vec_VecForEachEntryStart( Abc_Obj_t *, vLevels, pTemp, Lev, k, LevelOld )
    {
//        Counter--;
        pTemp->fMarkA = 0;
        assert( Abc_ObjLevel(pTemp) == Lev );
        Abc_ObjSetLevel( pTemp, Abc_ObjLevelNew(pTemp) );
        // if the level did not change, no need to check the fanout levels
        if ( Abc_ObjLevel(pTemp) == Lev )
            continue;
        // schedule fanout for level update
        Abc_ObjForEachFanout( pTemp, pFanout, m )
        {
            if ( !Abc_ObjIsCo(pFanout) && !pFanout->fMarkA )
            {
                assert( Abc_ObjLevel(pFanout) >= Lev );
                Vec_VecPush( vLevels, Abc_ObjLevel(pFanout), pFanout );
//                Counter++;
//                CounterMax = Abc_MaxFloat( CounterMax, Counter );
                pFanout->fMarkA = 1;
            }
        }
    }
//    printf( "%d ", CounterMax );
}